

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O3

int __thiscall
vkt::shaderexecutor::ShaderIntegerFunctionTests::init
          (ShaderIntegerFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  TestNode *pTVar3;
  TestNode *pTVar4;
  long lVar5;
  bool bVar6;
  int shaderTypeNdx;
  ShaderType SVar7;
  int prec_2;
  int iVar8;
  int prec;
  Precision PVar9;
  
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "uaddcarry","uaddcarry");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  iVar2 = 1;
  do {
    PVar9 = PRECISION_MEDIUMP;
    do {
      SVar7 = SHADERTYPE_VERTEX;
      do {
        pTVar4 = (TestNode *)operator_new(0xf0);
        UaddCarryCase::UaddCarryCase
                  ((UaddCarryCase *)pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                   iVar2 + TYPE_INT_VEC4,PVar9,SVar7);
        tcu::TestNode::addChild(pTVar3,pTVar4);
        SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
      } while (SVar7 != SHADERTYPE_LAST);
      PVar9 = PVar9 + PRECISION_MEDIUMP;
    } while (PVar9 != PRECISION_LAST);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 5);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "usubborrow","usubborrow");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  iVar2 = 1;
  do {
    PVar9 = PRECISION_MEDIUMP;
    do {
      SVar7 = SHADERTYPE_VERTEX;
      do {
        pTVar4 = (TestNode *)operator_new(0xf0);
        UsubBorrowCase::UsubBorrowCase
                  ((UsubBorrowCase *)pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                   iVar2 + TYPE_INT_VEC4,PVar9,SVar7);
        tcu::TestNode::addChild(pTVar3,pTVar4);
        SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
      } while (SVar7 != SHADERTYPE_LAST);
      PVar9 = PVar9 + PRECISION_MEDIUMP;
    } while (PVar9 != PRECISION_LAST);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 5);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "umulextended","umulextended");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  iVar2 = 1;
  do {
    iVar8 = 1;
    do {
      if (iVar8 == 2) {
        SVar7 = SHADERTYPE_VERTEX;
        do {
          pTVar4 = (TestNode *)operator_new(0xf0);
          UmulExtendedCase::UmulExtendedCase
                    ((UmulExtendedCase *)pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx
                     ,iVar2 + TYPE_INT_VEC4,PRECISION_HIGHP,SVar7);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
        } while (SVar7 != SHADERTYPE_LAST);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 3);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 5);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "imulextended","imulextended");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  iVar2 = 1;
  do {
    iVar8 = 1;
    do {
      if (iVar8 == 2) {
        SVar7 = SHADERTYPE_VERTEX;
        do {
          pTVar4 = (TestNode *)operator_new(0xf0);
          ImulExtendedCase::ImulExtendedCase
                    ((ImulExtendedCase *)pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx
                     ,iVar2 + TYPE_DOUBLE_MAT4,PRECISION_HIGHP,SVar7);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
        } while (SVar7 != SHADERTYPE_LAST);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 3);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 5);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "bitfieldextract","bitfieldextract");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar6 = bVar1;
    iVar2 = (&DAT_00b2d2c8)[lVar5];
    iVar8 = 1;
    do {
      PVar9 = PRECISION_MEDIUMP;
      do {
        SVar7 = SHADERTYPE_VERTEX;
        do {
          pTVar4 = (TestNode *)operator_new(0xf0);
          BitfieldExtractCase::BitfieldExtractCase
                    ((BitfieldExtractCase *)pTVar4,
                     (this->super_TestCaseGroup).super_TestNode.m_testCtx,iVar2 + -1 + iVar8,PVar9,
                     SVar7);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
        } while (SVar7 != SHADERTYPE_LAST);
        PVar9 = PVar9 + PRECISION_MEDIUMP;
      } while (PVar9 != PRECISION_LAST);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 5);
    lVar5 = 1;
    bVar1 = false;
  } while (bVar6);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "bitfieldinsert","bitfieldinsert");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar6 = bVar1;
    iVar2 = (&DAT_00b2d2c8)[lVar5];
    iVar8 = 1;
    do {
      PVar9 = PRECISION_MEDIUMP;
      do {
        SVar7 = SHADERTYPE_VERTEX;
        do {
          pTVar4 = (TestNode *)operator_new(0xf0);
          BitfieldInsertCase::BitfieldInsertCase
                    ((BitfieldInsertCase *)pTVar4,
                     (this->super_TestCaseGroup).super_TestNode.m_testCtx,iVar2 + -1 + iVar8,PVar9,
                     SVar7);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
        } while (SVar7 != SHADERTYPE_LAST);
        PVar9 = PVar9 + PRECISION_MEDIUMP;
      } while (PVar9 != PRECISION_LAST);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 5);
    lVar5 = 1;
    bVar1 = false;
  } while (bVar6);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "bitfieldreverse","bitfieldreverse");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar6 = bVar1;
    iVar2 = (&DAT_00b2d2c8)[lVar5];
    iVar8 = 1;
    do {
      PVar9 = PRECISION_MEDIUMP;
      do {
        SVar7 = SHADERTYPE_VERTEX;
        do {
          pTVar4 = (TestNode *)operator_new(0xf0);
          BitfieldReverseCase::BitfieldReverseCase
                    ((BitfieldReverseCase *)pTVar4,
                     (this->super_TestCaseGroup).super_TestNode.m_testCtx,iVar2 + -1 + iVar8,PVar9,
                     SVar7);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
        } while (SVar7 != SHADERTYPE_LAST);
        PVar9 = PVar9 + PRECISION_MEDIUMP;
      } while (PVar9 != PRECISION_LAST);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 5);
    lVar5 = 1;
    bVar1 = false;
  } while (bVar6);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"bitcount"
             ,"bitcount");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar6 = bVar1;
    iVar2 = (&DAT_00b2d2c8)[lVar5];
    iVar8 = 1;
    do {
      PVar9 = PRECISION_MEDIUMP;
      do {
        SVar7 = SHADERTYPE_VERTEX;
        do {
          pTVar4 = (TestNode *)operator_new(0xf0);
          BitCountCase::BitCountCase
                    ((BitCountCase *)pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                     iVar2 + -1 + iVar8,PVar9,SVar7);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
        } while (SVar7 != SHADERTYPE_LAST);
        PVar9 = PVar9 + PRECISION_MEDIUMP;
      } while (PVar9 != PRECISION_LAST);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 5);
    lVar5 = 1;
    bVar1 = false;
  } while (bVar6);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"findlsb",
             "findlsb");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar6 = bVar1;
    iVar2 = (&DAT_00b2d2c8)[lVar5];
    iVar8 = 1;
    do {
      PVar9 = PRECISION_MEDIUMP;
      do {
        SVar7 = SHADERTYPE_VERTEX;
        do {
          pTVar4 = (TestNode *)operator_new(0xf0);
          FindLSBCase::FindLSBCase
                    ((FindLSBCase *)pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                     iVar2 + -1 + iVar8,PVar9,SVar7);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
        } while (SVar7 != SHADERTYPE_LAST);
        PVar9 = PVar9 + PRECISION_MEDIUMP;
      } while (PVar9 != PRECISION_LAST);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 5);
    lVar5 = 1;
    bVar1 = false;
  } while (bVar6);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"findMSB",
             "findMSB");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar6 = bVar1;
    iVar2 = (&DAT_00b2d2c8)[lVar5];
    iVar8 = 1;
    do {
      PVar9 = PRECISION_MEDIUMP;
      do {
        SVar7 = SHADERTYPE_VERTEX;
        do {
          pTVar4 = (TestNode *)operator_new(0xf0);
          findMSBCase::findMSBCase
                    ((findMSBCase *)pTVar4,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                     iVar2 + -1 + iVar8,PVar9,SVar7);
          tcu::TestNode::addChild(pTVar3,pTVar4);
          SVar7 = SVar7 + SHADERTYPE_FRAGMENT;
        } while (SVar7 != SHADERTYPE_LAST);
        PVar9 = PVar9 + PRECISION_MEDIUMP;
      } while (PVar9 != PRECISION_LAST);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 5);
    lVar5 = 1;
    bVar1 = false;
  } while (bVar6);
  return 1;
}

Assistant:

void ShaderIntegerFunctionTests::init (void)
{
	enum
	{
		VS = (1<<glu::SHADERTYPE_VERTEX),
		FS = (1<<glu::SHADERTYPE_FRAGMENT),
		CS = (1<<glu::SHADERTYPE_COMPUTE),
		GS = (1<<glu::SHADERTYPE_GEOMETRY),
		TC = (1<<glu::SHADERTYPE_TESSELLATION_CONTROL),
		TE = (1<<glu::SHADERTYPE_TESSELLATION_EVALUATION),

		ALL_SHADERS = VS|TC|TE|GS|FS|CS
	};

	//																		Int?	Uint?	AllPrec?	Shaders
	addFunctionCases<UaddCarryCase>				(this,	"uaddcarry",		false,	true,	true,		ALL_SHADERS);
	addFunctionCases<UsubBorrowCase>			(this,	"usubborrow",		false,	true,	true,		ALL_SHADERS);
	addFunctionCases<UmulExtendedCase>			(this,	"umulextended",		false,	true,	false,		ALL_SHADERS);
	addFunctionCases<ImulExtendedCase>			(this,	"imulextended",		true,	false,	false,		ALL_SHADERS);
	addFunctionCases<BitfieldExtractCase>		(this,	"bitfieldextract",	true,	true,	true,		ALL_SHADERS);
	addFunctionCases<BitfieldInsertCase>		(this,	"bitfieldinsert",	true,	true,	true,		ALL_SHADERS);
	addFunctionCases<BitfieldReverseCase>		(this,	"bitfieldreverse",	true,	true,	true,		ALL_SHADERS);
	addFunctionCases<BitCountCase>				(this,	"bitcount",			true,	true,	true,		ALL_SHADERS);
	addFunctionCases<FindLSBCase>				(this,	"findlsb",			true,	true,	true,		ALL_SHADERS);
	addFunctionCases<findMSBCase>				(this,	"findMSB",			true,	true,	true,		ALL_SHADERS);
}